

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O1

int libsgp4::DateTime::DaysInMonth(int year,int month)

{
  bool bVar1;
  undefined1 *puVar2;
  
  if ((year - 1U < 9999) && (month - 1U < 0xc)) {
    bVar1 = IsLeapYear(year);
    puVar2 = (anonymous_namespace)::daysInMonth;
    if (bVar1) {
      puVar2 = (undefined1 *)0x10b484;
    }
    return *(int *)(puVar2 + (ulong)(uint)month * 4);
  }
  __assert_fail("false && \"Invalid year and month\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dnwrnr[P]sgp4/libsgp4/DateTime.h"
                ,0x107,"static int libsgp4::DateTime::DaysInMonth(int, int)");
}

Assistant:

static int DaysInMonth(int year, int month)
    {
        if (!IsValidYearMonth(year, month))
        {
            assert(false && "Invalid year and month");
        }
        
        const int* daysInMonthPtr;

        if (IsLeapYear(year))
        {
            daysInMonthPtr = daysInMonth[1];
        }
        else
        {
            daysInMonthPtr = daysInMonth[0];
        }

        return daysInMonthPtr[month];
    }